

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# musashi_softfloat.c
# Opt level: O1

float64 float64_add(float64 a,float64 b)

{
  float64 fVar1;
  ulong uVar2;
  short sVar3;
  ulong uVar5;
  byte zSign;
  ulong uVar6;
  bits64 zSig;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  ushort uVar4;
  
  zSign = (byte)(a >> 0x3f);
  if (a >> 0x3f == b >> 0x3f) {
    fVar1 = addFloat64Sigs(a,b,zSign);
    return fVar1;
  }
  uVar9 = (uint)(a >> 0x34) & 0x7ff;
  uVar8 = (uint)(b >> 0x34) & 0x7ff;
  uVar6 = (a & 0xfffffffffffff) << 10;
  uVar2 = (b & 0xfffffffffffff) << 10;
  uVar4 = (ushort)uVar9;
  uVar7 = (ushort)uVar8;
  sVar3 = uVar4 - uVar7;
  if (sVar3 == 0 || uVar4 < uVar7) {
    if (sVar3 < 0) {
      if (uVar8 == 0x7ff) {
        if ((b & 0xfffffffffffff) == 0) {
          return (ulong)(byte)~zSign << 0x3f | 0x7ff0000000000000;
        }
        goto LAB_0046819f;
      }
      uVar5 = uVar6 | 0x4000000000000000;
      if (uVar4 == 0) {
        uVar5 = uVar6;
      }
      sVar3 = -sVar3 - (ushort)(uVar4 == 0);
      if (sVar3 != 0) {
        if (sVar3 < 0x40) {
          uVar5 = (ulong)(uVar5 << (-(byte)sVar3 & 0x3f) != 0) | uVar5 >> ((byte)sVar3 & 0x3f);
        }
        else {
          uVar5 = (ulong)(uVar5 != 0);
        }
      }
      uVar2 = uVar2 | 0x4000000000000000;
      uVar4 = uVar7;
    }
    else {
      if (uVar4 == 0) {
        uVar4 = 1;
        uVar7 = 1;
      }
      else if (uVar9 == 0x7ff) {
        if (((b | a) & 0xfffffffffffff) == 0) {
          float_exception_flags = float_exception_flags | 1;
          return 0xffffffffffffffff;
        }
        goto LAB_0046819f;
      }
      if (uVar2 < uVar6) goto LAB_00468256;
      uVar5 = uVar6;
      uVar4 = uVar7;
      if (uVar2 <= uVar6) {
        return (ulong)(float_rounding_mode == '\x02') << 0x3f;
      }
    }
    zSig = uVar2 - uVar5;
    zSign = zSign ^ 1;
  }
  else {
    if (uVar9 == 0x7ff) {
      if ((a & 0xfffffffffffff) == 0) {
        return a;
      }
LAB_0046819f:
      fVar1 = propagateFloat64NaN(a,b);
      return fVar1;
    }
    uVar5 = uVar2 | 0x4000000000000000;
    if (uVar7 == 0) {
      uVar5 = uVar2;
    }
    uVar2 = uVar5;
    sVar3 = sVar3 - (ushort)(uVar7 == 0);
    if (sVar3 != 0) {
      if (sVar3 < 0x40) {
        uVar2 = (ulong)(uVar2 << (-(byte)sVar3 & 0x3f) != 0) | uVar2 >> ((byte)sVar3 & 0x3f);
      }
      else {
        uVar2 = (ulong)(uVar2 != 0);
      }
    }
    uVar6 = uVar6 | 0x4000000000000000;
LAB_00468256:
    zSig = uVar6 - uVar2;
  }
  fVar1 = normalizeRoundAndPackFloat64(zSign,uVar4 - 1,zSig);
  return fVar1;
}

Assistant:

float64 float64_add( float64 a, float64 b )
{
	flag aSign, bSign;

	aSign = extractFloat64Sign( a );
	bSign = extractFloat64Sign( b );
	if ( aSign == bSign ) {
		return addFloat64Sigs( a, b, aSign );
	}
	else {
		return subFloat64Sigs( a, b, aSign );
	}

}